

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O1

bool chaiscript::dispatch::detail::
     compare_types_cast<chaiscript::Boxed_Value,chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,0ul,1ul>
               (undefined8 param_1,long *param_2,Type_Conversions_State *param_3)

{
  chaiscript local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  chaiscript local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  boxed_cast<chaiscript::Boxed_Value>(local_30,(Boxed_Value *)*param_2,param_3);
  boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&>
            (local_20,(Boxed_Value *)(*param_2 + 0x10),param_3);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return true;
}

Assistant:

bool compare_types_cast(Indexes<I...>, Ret (*)(Params...),
             const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          try {
            (void)params; (void)t_conversions;
            (void)std::initializer_list<int>{(boxed_cast<Params>(params[I], &t_conversions), 0)...};
            return true;
          } catch (const exception::bad_boxed_cast &) {
            return false;
          }

        }